

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O3

void __thiscall
AlignmentRecord::noOverlapMerge
          (AlignmentRecord *this,string *algn,string *ref,string *dna,string *qualities,
          string *nucigar,int *c_pos,int *q_pos,int *ref_pos,int *ref_rel_pos,int i)

{
  pointer pcVar1;
  char cVar2;
  ShortDnaSequence *this_00;
  char cVar5;
  undefined1 *local_70;
  ulong local_68;
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  char cVar3;
  char cVar4;
  
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  local_50[0] = local_40;
  if (i == 1) {
    cVar5 = (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[*c_pos];
    pcVar1 = (this->reference_seq1)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,pcVar1 + (this->reference_seq1)._M_string_length);
    std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    this_00 = &this->sequence1;
  }
  else {
    cVar5 = (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[*c_pos];
    pcVar1 = (this->reference_seq2)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,pcVar1,pcVar1 + (this->reference_seq2)._M_string_length);
    std::__cxx11::string::operator=((string *)&local_70,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    this_00 = &this->sequence2;
  }
  cVar2 = (char)algn;
  cVar3 = (char)ref;
  cVar4 = (char)nucigar;
  switch(cVar5) {
  case 'D':
    std::__cxx11::string::push_back(cVar2);
    if (local_68 <= (ulong)(long)*ref_rel_pos) {
LAB_00172caa:
      std::__throw_out_of_range_fmt
                ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)");
    }
    std::__cxx11::string::push_back(cVar3);
    *ref_rel_pos = *ref_rel_pos + 1;
    std::__cxx11::string::push_back(cVar4);
    q_pos = ref_pos;
    break;
  case 'E':
  case 'F':
  case 'G':
  case 'J':
  case 'K':
  case 'L':
    goto switchD_00172b2c_caseD_45;
  case 'H':
    q_pos = ref_pos;
    ref_pos = ref_rel_pos;
    goto LAB_00172c78;
  case 'I':
    ShortDnaSequence::operator[](this_00,(long)*q_pos);
    std::__cxx11::string::push_back((char)dna);
    ShortDnaSequence::operator[](this_00,(long)*q_pos);
    std::__cxx11::string::push_back(cVar2);
    ShortDnaSequence::qualityChar(this_00,(long)*q_pos);
    std::__cxx11::string::push_back((char)qualities);
    std::__cxx11::string::push_back(cVar3);
    std::__cxx11::string::push_back(cVar4);
    break;
  case 'M':
    ShortDnaSequence::operator[](this_00,(long)*q_pos);
    std::__cxx11::string::push_back((char)dna);
    ShortDnaSequence::operator[](this_00,(long)*q_pos);
    std::__cxx11::string::push_back(cVar2);
    ShortDnaSequence::qualityChar(this_00,(long)*q_pos);
    std::__cxx11::string::push_back((char)qualities);
    if (local_68 <= (ulong)(long)*ref_rel_pos) goto LAB_00172caa;
    std::__cxx11::string::push_back(cVar3);
    std::__cxx11::string::push_back(cVar4);
    goto LAB_00172c63;
  default:
    if (cVar5 != 'S') goto switchD_00172b2c_caseD_45;
LAB_00172c63:
    *ref_rel_pos = *ref_rel_pos + 1;
LAB_00172c78:
    *ref_pos = *ref_pos + 1;
  }
  *q_pos = *q_pos + 1;
  *c_pos = *c_pos + 1;
switchD_00172b2c_caseD_45:
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return;
}

Assistant:

void AlignmentRecord::noOverlapMerge(std::string& algn,std::string& ref,std::string& dna, std::string& qualities, std::string& nucigar, int& c_pos, int& q_pos, int& ref_pos, int& ref_rel_pos, int i) const{
    char c;
    const ShortDnaSequence* s = 0;
    std::string r = "";
    if (i == 1){
        c = this->cigar1_unrolled[c_pos];
        s = &this->sequence1;
        r = this->getReferenceSeq1();
    } else {
        c = this->cigar2_unrolled[c_pos];
        s = &this->sequence2;
        r = this->getReferenceSeq2();
    }
    if (c == 'H'){
        ref_rel_pos++;
        ref_pos++;
        c_pos++;
    } else if (c == 'I') {
        dna += (*s)[q_pos];
        algn += (*s)[q_pos];
        qualities += s->qualityChar(q_pos);
        ref+= 'I';
        nucigar += 'I';
        q_pos++;
        c_pos++;
    } else if (c == 'D') {
        algn += 'D';
        ref+= r.at(ref_rel_pos);
        ref_rel_pos++;
        nucigar += 'D';
        ref_pos++;
        c_pos++;
    } else if (c == 'S'){
        ref_rel_pos++;
        ref_pos++;
        q_pos++;
        c_pos++;
    } else if (c == 'M'){
        dna += (*s)[q_pos];
        algn += (*s)[q_pos];
        qualities += s->qualityChar(q_pos);
        ref+= r.at(ref_rel_pos);

        nucigar += c;
        ref_rel_pos++;
        ref_pos++;
        q_pos++;
        c_pos++;
    } else {
        assert(false);

    }
}